

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall antlr::CharScanner::reportError(CharScanner *this,string *s)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  long *in_RDI;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  (**(code **)(*in_RDI + 0xd0))();
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"error: ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    (**(code **)(*in_RDI + 0xd0))();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CharScanner::reportError(const ANTLR_USE_NAMESPACE(std)string& s)
{
	if (getFilename() == "")
		ANTLR_USE_NAMESPACE(std)cerr << "error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
	else
		ANTLR_USE_NAMESPACE(std)cerr << getFilename().c_str() << ": error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
}